

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  u8 uVar1;
  ExprList *pEVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iReg;
  int iVar6;
  char *pcVar7;
  void *pvVar8;
  Expr *p_00;
  VdbeOp *pVVar9;
  u32 in_ECX;
  u32 in_EDX;
  Expr *in_RSI;
  Parse *in_RDI;
  long in_FS_OFFSET;
  int r3;
  CollSeq *pColl_1;
  Expr *p_1;
  VdbeOp *pOp;
  Expr *p;
  int op_1;
  int op;
  int ii;
  int regCkNull;
  int r2;
  int labelOk;
  CollSeq *pColl;
  ExprList *pList;
  u8 okConstFactor;
  int addrTop;
  int destNotNull;
  int addrTruthOp;
  int destStep6;
  int destStep2;
  int i;
  Expr *pLeft;
  int nVector;
  char *zAff;
  int *aiMap;
  Vdbe *v;
  int rLhsOrig;
  int rLhs;
  int eType;
  int regToFree;
  int iTab;
  int iDummy;
  int rRhsHasNull;
  int in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  uint p2;
  Parse *pParse_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Parse *in_stack_ffffffffffffff30;
  Parse *pParse_01;
  Expr *in_stack_ffffffffffffff38;
  Parse *in_stack_ffffffffffffff40;
  int local_a8;
  int local_a4;
  int local_74;
  int local_6c;
  Vdbe *p_01;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Expr *pEVar13;
  Parse *pParse_02;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = 0;
  uVar12 = 0xaaaaaaaa;
  uVar11 = 0xaaaaaaaa;
  uVar10 = 0xaaaaaaaa;
  local_74 = 0;
  uVar1 = in_RDI->okConstFactor;
  iVar3 = sqlite3ExprCheckIN((Parse *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             (Expr *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (iVar3 != 0) goto LAB_001ce1ba;
  pcVar7 = exprINAffinity(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  iVar3 = sqlite3ExprVectorSize(in_RSI->pLeft);
  pvVar8 = sqlite3DbMallocZero((sqlite3 *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (in_RDI->db->mallocFailed == '\0') {
    p_01 = in_RDI->pVdbe;
    if (in_EDX == in_ECX) {
      pParse_00 = (Parse *)0x0;
    }
    else {
      pParse_00 = (Parse *)&stack0xfffffffffffffff4;
    }
    pEVar13 = in_RSI;
    pParse_02 = in_RDI;
    iVar4 = sqlite3FindInIndex(in_RDI,in_RSI,in_EDX,(int *)CONCAT44(uVar12,uVar11),
                               (int *)CONCAT44(uVar10,in_stack_ffffffffffffffc0),(int *)p_01);
    pParse_02->okConstFactor = '\0';
    iVar5 = exprCodeVector(pParse_00,
                           (Expr *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    pParse_02->okConstFactor = uVar1;
    local_6c = 0;
    while( true ) {
      p2 = in_stack_ffffffffffffff0c & 0xffffff;
      if (local_6c < iVar3) {
        p2 = CONCAT13(*(int *)((long)pvVar8 + (long)local_6c * 4) == local_6c,
                      (int3)in_stack_ffffffffffffff0c);
      }
      if ((char)(p2 >> 0x18) == '\0') break;
      local_6c = local_6c + 1;
      in_stack_ffffffffffffff0c = p2;
    }
    iReg = iVar5;
    if (local_6c != iVar3) {
      iReg = sqlite3GetTempRange((Parse *)CONCAT44(p2,in_stack_ffffffffffffff08),
                                 in_stack_ffffffffffffff04);
      for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
        sqlite3VdbeAddOp3((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                          in_stack_ffffffffffffff08);
      }
    }
    if (iVar4 == 5) {
      sqlite3VdbeMakeLabel(pParse_02);
      local_a4 = 0;
      pEVar2 = (pEVar13->x).pList;
      sqlite3ExprCollSeq(in_stack_ffffffffffffff30,
                         (Expr *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (in_ECX != in_EDX) {
        local_a4 = sqlite3GetTempReg(pParse_02);
        sqlite3VdbeAddOp3((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                          in_stack_ffffffffffffff08);
      }
      for (local_a8 = 0; local_a8 < pEVar2->nExpr; local_a8 = local_a8 + 1) {
        sqlite3ExprCodeTemp(pParse_00,(Expr *)CONCAT44(p2,in_stack_ffffffffffffff08),
                            (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        if ((local_a4 != 0) && (iVar3 = sqlite3ExprCanBeNull(pEVar2->a[local_a8].pExpr), iVar3 != 0)
           ) {
          sqlite3VdbeAddOp3((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                            in_stack_ffffffffffffff08);
        }
        sqlite3ReleaseTempReg(pParse_02,-0x55555556);
        if ((local_a8 < pEVar2->nExpr + -1) || (in_ECX != in_EDX)) {
          in_stack_fffffffffffffef8 = -2;
          sqlite3VdbeAddOp4((Vdbe *)pParse_00,p2,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
                            ,in_stack_ffffffffffffff00,
                            (char *)CONCAT44(in_stack_fffffffffffffefc,0xfffffffe),(int)in_RSI);
          sqlite3VdbeChangeP5(p_01,(short)*pcVar7);
        }
        else {
          in_stack_fffffffffffffef8 = -2;
          sqlite3VdbeAddOp4((Vdbe *)pParse_00,p2,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04
                            ,in_stack_ffffffffffffff00,
                            (char *)CONCAT44(in_stack_fffffffffffffefc,0xfffffffe),(int)in_RSI);
          sqlite3VdbeChangeP5(p_01,(short)*pcVar7 | 0x10);
        }
      }
      if (local_a4 != 0) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
      }
      sqlite3VdbeResolveLabel((Vdbe *)pParse_00,p2);
      sqlite3ReleaseTempReg(pParse_02,local_a4);
    }
    else {
      if (in_ECX != in_EDX) {
        local_74 = sqlite3VdbeMakeLabel(pParse_02);
      }
      for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
        p_00 = sqlite3VectorFieldSubexpr
                         ((Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
        if (pParse_02->nErr != 0) goto LAB_001ce18a;
        iVar6 = sqlite3ExprCanBeNull(p_00);
        if (iVar6 != 0) {
          sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
        }
      }
      if (iVar4 == 1) {
        sqlite3VdbeAddOp3((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                          in_stack_ffffffffffffff08);
        sqlite3VdbeAddOp0((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffefc);
      }
      else {
        in_stack_fffffffffffffef8 = iVar3;
        sqlite3VdbeAddOp4((Vdbe *)pParse_00,p2,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                          in_stack_ffffffffffffff00,
                          (char *)CONCAT44(in_stack_fffffffffffffefc,iVar3),(int)in_RSI);
        if (in_EDX == in_ECX) {
          if ((((pEVar13->flags & 0x2000000) != 0) &&
              (pVVar9 = sqlite3VdbeGetOp(p_01,(pEVar13->y).sub.iAddr), pVVar9->opcode == '\x0f')) &&
             (0 < pVVar9->p3)) {
            sqlite3VdbeAddOp4Int
                      ((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                       in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
          }
          sqlite3VdbeAddOp4Int
                    ((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                     in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
          goto LAB_001ce164;
        }
        sqlite3VdbeAddOp4Int
                  ((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                   in_stack_ffffffffffffff08,in_stack_ffffffffffffff04);
      }
      if ((local_c != 0) && (iVar3 == 1)) {
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
      }
      if (in_EDX == in_ECX) {
        sqlite3VdbeGoto((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc);
      }
      if (local_74 != 0) {
        sqlite3VdbeResolveLabel((Vdbe *)pParse_00,p2);
      }
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
      if (1 < iVar3) {
        sqlite3VdbeMakeLabel(pParse_02);
      }
      for (local_6c = 0; local_6c < iVar3; local_6c = local_6c + 1) {
        pParse_01 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
        iVar4 = sqlite3GetTempReg(pParse_02);
        sqlite3VectorFieldSubexpr
                  ((Expr *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),0);
        sqlite3ExprCollSeq(pParse_01,(Expr *)CONCAT44(iVar4,in_stack_ffffffffffffff28));
        sqlite3VdbeAddOp3((Vdbe *)in_RDI,(int)((ulong)pParse_00 >> 0x20),(int)pParse_00,p2,
                          in_stack_ffffffffffffff08);
        in_stack_fffffffffffffef8 = -2;
        sqlite3VdbeAddOp4((Vdbe *)pParse_00,p2,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                          in_stack_ffffffffffffff00,
                          (char *)CONCAT44(in_stack_fffffffffffffefc,0xfffffffe),(int)in_RSI);
        sqlite3ReleaseTempReg(pParse_02,iVar4);
      }
      sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
      if (1 < iVar3) {
        sqlite3VdbeResolveLabel((Vdbe *)pParse_00,p2);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
        sqlite3VdbeAddOp2((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,0);
      }
      sqlite3VdbeJumpHere((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                          in_stack_fffffffffffffefc);
    }
LAB_001ce164:
    if (iReg != iVar5) {
      sqlite3ReleaseTempReg(pParse_02,iReg);
    }
  }
LAB_001ce18a:
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  sqlite3DbFree((sqlite3 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                (void *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
LAB_001ce1ba:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */
  int iTab = 0;         /* Index to use */
  u8 okConstFactor = pParse->okConstFactor;

  assert( !ExprHasVVAProperty(pExpr,EP_Immutable) );
  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(pParse->db, nVector*sizeof(int));
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a
  ** vector, then it is stored in an array of nVector registers starting
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  **
  ** Avoid factoring the LHS of the IN(...) expression out of the loop,
  ** even if it is constant, as OP_Affinity may be used on the register
  ** by code generated below.  */
  assert( pParse->okConstFactor==okConstFactor );
  pParse->okConstFactor = 0;
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  pParse->okConstFactor = okConstFactor;
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList;
    CollSeq *pColl;
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( ExprUseXList(pExpr) );
    pList = pExpr->x.pList;
    pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        int op = rLhs!=r2 ? OP_Eq : OP_NotNull;
        sqlite3VdbeAddOp4(v, op, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_Eq);
        VdbeCoverageIf(v, ii<pList->nExpr-1 && op==OP_NotNull);
        VdbeCoverageIf(v, ii==pList->nExpr-1 && op==OP_NotNull);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        int op = rLhs!=r2 ? OP_Ne : OP_IsNull;
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, op, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, op==OP_Ne);
        VdbeCoverageIf(v, op==OP_IsNull);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( pParse->nErr ) goto sqlite3ExprCodeIN_oom_error;
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      if( ExprHasProperty(pExpr, EP_Subrtn) ){
        const VdbeOp *pOp = sqlite3VdbeGetOp(v, pExpr->y.sub.iAddr);
        assert( pOp->opcode==OP_Once || pParse->nErr );
        if( pOp->opcode==OP_Once && pOp->p3>0 ){
          assert( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) );
          sqlite3VdbeAddOp4Int(v, OP_Filter, pOp->p3, destIfFalse,
                               rLhs, nVector); VdbeCoverage(v);
        }
      }
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false.
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}